

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::iterate(TextureCubeShadowCase *this)

{
  code *pcVar1;
  TestContext *pTVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  qpTestResult qVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  RenderTarget *pRVar9;
  char *str;
  TestLog *pTVar10;
  NotSupportedError *this_00;
  MessageBuilder *pMVar11;
  reference pvVar12;
  PixelFormat *pPVar13;
  TextureCube *pTVar14;
  size_type sVar15;
  MessageBuilder local_918;
  ConstPixelBufferAccess local_798;
  undefined1 local_76d;
  undefined1 auStack_76c [7];
  bool isOk;
  int local_764;
  MessageBuilder local_760;
  ConstPixelBufferAccess local_5e0;
  undefined1 local_5b1;
  undefined1 auStack_5b0 [7];
  bool isHighQuality;
  int local_5a8;
  Vector<int,_3> local_5a4;
  undefined1 local_598 [8];
  TexComparePrecision texComparePrecision;
  LodPrecision lodPrecision;
  PixelFormat pixelFormat;
  char *local_530;
  MessageBuilder local_528;
  undefined1 local_3a8 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface result;
  CubeFace face;
  int faceNdx;
  Sampler local_1f0;
  undefined1 local_1b4 [8];
  ReferenceParams sampleParams;
  FilterCase *curCase;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ScopedLogSection local_38;
  ScopedLogSection iterSection;
  int local_28;
  RandomViewport viewport;
  int viewportSize;
  Functions *gl;
  TextureCubeShadowCase *this_local;
  long lVar8;
  
  pRVar7 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  pRVar9 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  dVar5 = ::deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)((long)&iterSection.m_log + 4),pRVar9,0x1c,0x1c,dVar4 ^ dVar5);
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Test",&local_79);
  de::toString<int>(&local_b0,&this->m_caseNdx);
  std::operator+(&local_58,&local_78,&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Test ",&local_f1);
  de::toString<int>((string *)&curCase,&this->m_caseNdx);
  std::operator+(&local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curCase);
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar10,&local_58,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&curCase);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  sampleParams._140_8_ =
       std::
       vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
       ::operator[](&this->m_cases,(long)this->m_caseNdx);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_1b4,TEXTURETYPE_CUBE);
  if ((0x1b < viewport.x) && (0x1b < viewport.y)) {
    pcVar1 = *(code **)(lVar8 + 0xb8);
    dVar4 = glu::TextureCube::getGLTexture(*(TextureCube **)sampleParams._140_8_);
    (*pcVar1)(0x8513,dVar4);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2801,this->m_minFilter);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2800,this->m_magFilter);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2802,this->m_wrapS);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2803,this->m_wrapT);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x884c,0x884e);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x884d,this->m_compareFunc);
    (**(code **)(lVar8 + 0x1a00))(iterSection.m_log._4_4_,local_28,viewport.x,viewport.y);
    glu::mapGLSampler(&local_1f0,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
    tcu::Sampler::operator=
              ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_1f0);
    sampleParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
    sampleParams.sampler.lodThreshold = (float)glu::mapGLCompareFunc(this->m_compareFunc);
    local_1b4._4_4_ = SAMPLERTYPE_SHADOW;
    sampleParams.sampler.seamlessCubeMap = false;
    sampleParams.sampler._53_3_ = 0;
    sampleParams.super_RenderParams.w.m_data[3] = *(float *)(sampleParams._140_8_ + 0x18);
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&face,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&face,(char (*) [28])"Compare reference value =  ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,sampleParams.super_RenderParams.w.m_data + 3);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2b9e07b);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])"Coordinates: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(Vector<float,_2> *)(sampleParams._140_8_ + 8));
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [5])" -> ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(Vector<float,_2> *)(sampleParams._140_8_ + 0x10));
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&face);
    for (result.m_pixels.m_cap._4_4_ = CUBEFACE_NEGATIVE_X; (int)result.m_pixels.m_cap._4_4_ < 6;
        result.m_pixels.m_cap._4_4_ = result.m_pixels.m_cap._4_4_ + CUBEFACE_POSITIVE_X) {
      tcu::Surface::Surface
                ((Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,viewport.x,viewport.y);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_3a8);
      glu::TextureTestUtil::computeQuadTexCoordCube
                ((vector<float,_std::allocator<float>_> *)local_3a8,result.m_pixels.m_cap._4_4_,
                 (Vec2 *)(sampleParams._140_8_ + 8),(Vec2 *)(sampleParams._140_8_ + 0x10));
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_528,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<(&local_528,(char (*) [6])0x2c435df);
      local_530 = getFaceDesc(result.m_pixels.m_cap._4_4_);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_530);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_528);
      pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_3a8,0);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar12,(RenderParams *)local_1b4);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"Draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
                      ,0x288);
      pRVar7 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = iterSection.m_log._4_4_;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&pixelFormat.blueBits,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      glu::readPixels(pRVar7,iVar3,local_28,(PixelBufferAccess *)&pixelFormat.blueBits);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"Read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
                      ,0x28b);
      pRVar9 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
      pPVar13 = tcu::RenderTarget::getPixelFormat(pRVar9);
      lodPrecision.derivateBits = pPVar13->redBits;
      lodPrecision.lodBits = pPVar13->greenBits;
      pixelFormat.redBits = pPVar13->blueBits;
      pixelFormat.greenBits = pPVar13->alphaBits;
      tcu::LodPrecision::LodPrecision
                ((LodPrecision *)&texComparePrecision.referenceBits,RULE_OPENGL);
      tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_598);
      texComparePrecision.resultBits = 10;
      lodPrecision.rule = 5;
      tcu::Vector<int,_3>::Vector(&local_5a4,10,10,10);
      texComparePrecision.coordBits.m_data[0] = local_5a4.m_data[2];
      local_598._0_4_ = local_5a4.m_data[0];
      local_598._4_4_ = local_5a4.m_data[1];
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_5b0,6,6,0);
      texComparePrecision.uvwBits.m_data[0] = local_5a8;
      texComparePrecision.coordBits.m_data[1] = auStack_5b0._0_4_;
      texComparePrecision.coordBits.m_data[2] = stack0xfffffffffffffa54;
      texComparePrecision.uvwBits.m_data[1] = 5;
      texComparePrecision.uvwBits.m_data[2] = 0x10;
      texComparePrecision.pcfBits = lodPrecision.derivateBits + -1;
      pTVar2 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&local_5e0,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pTVar14 = glu::TextureCube::getRefTexture(*(TextureCube **)sampleParams._140_8_);
      pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_3a8,0);
      local_5b1 = verifyTexCompareResult<tcu::TextureCube>
                            (pTVar2,&local_5e0,pTVar14,pvVar12,(ReferenceParams *)local_1b4,
                             (TexComparePrecision *)local_598,
                             (LodPrecision *)&texComparePrecision.referenceBits,
                             (PixelFormat *)&lodPrecision.derivateBits);
      if (!(bool)local_5b1) {
        pTVar10 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_760,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (&local_760,
                             (char (*) [66])
                             "Warning: Verification assuming high-quality PCF filtering failed.");
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_760);
        lodPrecision.rule = 4;
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_76c,4,4,0);
        texComparePrecision.uvwBits.m_data[0] = local_764;
        texComparePrecision.coordBits.m_data[1] = auStack_76c._0_4_;
        texComparePrecision.coordBits.m_data[2] = stack0xfffffffffffff898;
        texComparePrecision.uvwBits.m_data[1] = 0;
        pTVar2 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        tcu::Surface::getAccess
                  ((PixelBufferAccess *)&local_798,
                   (Surface *)
                   &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        pTVar14 = glu::TextureCube::getRefTexture(*(TextureCube **)sampleParams._140_8_);
        pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_3a8,0);
        local_76d = verifyTexCompareResult<tcu::TextureCube>
                              (pTVar2,&local_798,pTVar14,pvVar12,(ReferenceParams *)local_1b4,
                               (TexComparePrecision *)local_598,
                               (LodPrecision *)&texComparePrecision.referenceBits,
                               (PixelFormat *)&lodPrecision.derivateBits);
        if ((bool)local_76d) {
          qVar6 = tcu::TestContext::getTestResult
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          if (qVar6 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_QUALITY_WARNING,"Low-quality result");
          }
        }
        else {
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_918,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_918,
                               (char (*) [82])
                               "ERROR: Verification against low precision requirements failed, failing test case."
                              );
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_918);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Image verification failed");
        }
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_3a8);
      tcu::Surface::~Surface
                ((Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    this->m_caseNdx = this->m_caseNdx + 1;
    iVar3 = this->m_caseNdx;
    sVar15 = std::
             vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
             ::size(&this->m_cases);
    tcu::ScopedLogSection::~ScopedLogSection(&local_38);
    return (uint)(iVar3 < (int)sVar15);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Too small render target",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
             ,0x25f);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureCubeShadowCase::IterateResult TextureCubeShadowCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const int						viewportSize	= 28;
	const RandomViewport			viewport		(m_context.getRenderTarget(), viewportSize, viewportSize, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::ScopedLogSection		iterSection		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	ReferenceParams					sampleParams	(TEXTURETYPE_CUBE);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Too small render target", DE_NULL, __FILE__, __LINE__);

	// Setup texture
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_COMPARE_MODE,	GL_COMPARE_REF_TO_TEXTURE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_COMPARE_FUNC,	m_compareFunc);

	// Other state
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Params for reference computation.
	sampleParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.sampler.compare			= glu::mapGLCompareFunc(m_compareFunc);
	sampleParams.samplerType				= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode					= LODMODE_EXACT;
	sampleParams.ref						= curCase.ref;

	m_testCtx.getLog()
		<< TestLog::Message
		<< "Compare reference value =  " << sampleParams.ref << "\n"
		<< "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight
		<< TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		m_testCtx.getLog() << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const tcu::PixelFormat		pixelFormat		= m_context.getRenderTarget().getPixelFormat();
			tcu::LodPrecision			lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::TexComparePrecision	texComparePrecision;

			lodPrecision.derivateBits			= 10;
			lodPrecision.lodBits				= 5;
			texComparePrecision.coordBits		= tcu::IVec3(10,10,10);
			texComparePrecision.uvwBits			= tcu::IVec3(6,6,0);
			texComparePrecision.pcfBits			= 5;
			texComparePrecision.referenceBits	= 16;
			texComparePrecision.resultBits		= pixelFormat.redBits-1;

			const bool isHighQuality = verifyTexCompareResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
															  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				m_testCtx.getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

				lodPrecision.lodBits			= 4;
				texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
				texComparePrecision.pcfBits		= 0;

				const bool isOk = verifyTexCompareResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}